

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stresstest.c
# Opt level: O2

void fill(int64_t *dst,int size,int type)

{
  int64_t iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  int iStack_20;
  
  if (0x14 < (uint)type) {
    abort();
  }
  uVar6 = (ulong)(uint)size;
  switch(type) {
  case 0:
    fill_random(dst,size);
    return;
  case 1:
    fill_dup50(dst,size);
    return;
  case 2:
    fill_random2(dst,size);
    return;
  case 3:
    fill_random10(dst,size);
    return;
  case 4:
    fill_random(dst,size);
    goto LAB_0010c49d;
  case 5:
    fill_dup50(dst,size);
    goto LAB_0010c49d;
  case 6:
    fill_random2(dst,size);
    goto LAB_0010c49d;
  case 7:
    fill_random10(dst,size);
LAB_0010c49d:
    make_mixed(dst,size);
    return;
  case 8:
    fill_sorted(dst,size);
    return;
  case 9:
    fill_sorted(dst,size);
    uVar2 = *dst;
    for (uVar7 = (uint)size >> 4; -1 < (int)uVar7; uVar7 = uVar7 - 1) {
      uVar2 = uVar2 * 0x5851f42d4c957f2d + 1;
      uVar4 = (uVar2 >> 0x1d) % uVar6;
      uVar2 = uVar2 * 0x5851f42d4c957f2d + 1;
      uVar5 = (uVar2 >> 0x1d) % uVar6;
      iVar1 = dst[uVar4];
      dst[uVar4] = dst[uVar5];
      dst[uVar5] = iVar1;
    }
    break;
  case 10:
    lVar3 = 0;
    while (uVar6 != 0) {
      dst[uVar6 & 0xffffffff] = lVar3;
      lVar3 = lVar3 + 1;
      uVar6 = uVar6 - 1;
    }
    break;
  case 0xb:
    fill_random2(dst,size);
    goto LAB_0010c38d;
  case 0xc:
    fill_random10(dst,size);
LAB_0010c38d:
    qsort(dst,(long)size,8,simple_cmp_reverse);
    return;
  case 0xd:
    for (uVar2 = 0; uVar6 != uVar2; uVar2 = uVar2 + 1) {
      dst[uVar2] = 0;
    }
    break;
  case 0xe:
    iStack_20 = 10;
    goto LAB_0010c41d;
  case 0xf:
    iStack_20 = 100;
    goto LAB_0010c41d;
  case 0x10:
    iStack_20 = 10000;
LAB_0010c41d:
    fill_sorted_blocks(dst,size,iStack_20);
    return;
  case 0x11:
    iStack_20 = 2;
    goto LAB_0010c4ad;
  case 0x12:
    iStack_20 = 8;
LAB_0010c4ad:
    fill_swapped(dst,size,size / iStack_20);
    return;
  case 0x13:
    for (uVar2 = 0; uVar6 != uVar2; uVar2 = uVar2 + 1) {
      dst[uVar2] = uVar2 ^ 1;
    }
    break;
  case 0x14:
    uVar2 = 0;
    while (uVar6 != 0) {
      uVar4 = uVar6;
      if ((uVar2 & 1) != 0) {
        uVar4 = uVar2;
      }
      dst[uVar2] = uVar4 & 0xffffffff;
      uVar2 = uVar2 + 1;
      uVar6 = uVar6 - 1;
    }
  }
  return;
}

Assistant:

static void fill(int64_t *dst, const int size, int type) {
  switch (type) {
  case FILL_RANDOM:
    fill_random(dst, size);
    break;

  case FILL_RNDDUP50:
    fill_dup50(dst, size);
    break;

  case FILL_RANDOM2:
    fill_random2(dst, size);
    break;

  case FILL_RANDOM10:
    fill_random10(dst, size);
    break;

  case FILL_MIXED:
    fill_random(dst, size);
    make_mixed(dst, size);
    break;

  case FILL_MIXDUP50:
    fill_dup50(dst, size);
    make_mixed(dst, size);
    break;

  case FILL_MIXED2:
    fill_random2(dst, size);
    make_mixed(dst, size);
    break;

  case FILL_MIXED10:
    fill_random10(dst, size);
    make_mixed(dst, size);
    break;

  case FILL_SORTED:
    fill_sorted(dst, size);
    break;

  case FILL_SORTED94:
    fill_sorted(dst, size);
    make_disord6(dst, size);
    break;

  case FILL_REVERSE:
    fill_reverse(dst, size);
    break;

  case FILL_REVERSE2:
    fill_random2(dst, size);
    qsort(dst, size, sizeof(int64_t), simple_cmp_reverse);
    break;

  case FILL_REVERSE10:
    fill_random10(dst, size);
    qsort(dst, size, sizeof(int64_t), simple_cmp_reverse);
    break;

  case FILL_ALLSAME:
    fill_same(dst, size);
    break;

  case FILL_SORTED_10:
    fill_sorted_blocks(dst, size, 10);
    break;

  case FILL_SORTED_100:
    fill_sorted_blocks(dst, size, 100);
    break;

  case FILL_SORTED_10000:
    fill_sorted_blocks(dst, size, 10000);
    break;

  case FILL_SWAPPED_N2:
    fill_swapped(dst, size, size / 2);
    break;

  case FILL_SWAPPED_N8:
    fill_swapped(dst, size, size / 8);
    break;

  case FILL_EVIL1:
    for (unsigned i = 0; i < size; i++)
      dst[i] = i ^ 1;
    break;

  case FILL_EVIL2:
    for (unsigned i = 0; i < size; i++)
      dst[i] = (i & 1) ? i : size - i;
    break;

  default:
    abort();
  }
}